

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
                 *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  size_type sVar2;
  Value *pVVar3;
  size_type sVar4;
  ValueMapEntryAccessorType *dest;
  KeyMapEntryAccessorType *dest_00;
  bool bVar5;
  byte local_51;
  byte local_41;
  size_type map_size;
  ParseContext *ctx_local;
  char *ptr_local;
  Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  *this_local;
  
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  bVar1 = ParseContext::Done(ctx,(char **)&ctx_local);
  bVar5 = false;
  if (!bVar1) {
    bVar5 = *(char *)&(ctx_local->super_EpsCopyInputStream).limit_end_ == '\n';
  }
  if (!bVar5) {
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
    NewEntry(this);
    goto LAB_00298826;
  }
  ctx_local = (ParseContext *)
              MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Read((char *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1),ctx,
                     &this->key_);
  local_41 = 1;
  if (ctx_local != (ParseContext *)0x0) {
    bVar5 = CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse::ValidateKey
                      (&this->key_);
    local_41 = bVar5 ^ 0xff;
  }
  if ((local_41 & 1) != 0) {
    return (char *)0x0;
  }
  bVar1 = ParseContext::Done(ctx,(char **)&ctx_local);
  bVar5 = false;
  if (!bVar1) {
    bVar5 = *(char *)&(ctx_local->super_EpsCopyInputStream).limit_end_ == '\x12';
  }
  if (bVar5) {
    sVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
            ::size(this->map_);
    pVVar3 = Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>::
             operator[]<std::__cxx11::string&,void>
                       ((Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value> *)
                        this->map_,&this->key_);
    this->value_ptr_ = pVVar3;
    sVar4 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
            ::size(this->map_);
    if (sVar2 == sVar4) goto LAB_002987dd;
    ctx_local = (ParseContext *)
                MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::MILSpec::Value>
                ::Read((char *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1),ctx,
                       this->value_ptr_);
    local_51 = 1;
    if (ctx_local != (ParseContext *)0x0) {
      bVar5 = CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse::ValidateValue
                        (this->value_ptr_);
      local_51 = bVar5 ^ 0xff;
    }
    if ((local_51 & 1) != 0) {
      Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>::erase<std::__cxx11::string>
                ((Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value> *)this->map_,
                 &this->key_);
      return (char *)0x0;
    }
    bVar5 = ParseContext::Done(ctx,(char **)&ctx_local);
    if (bVar5) {
      return (char *)ctx_local;
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
    NewEntry(this);
    pVVar3 = this->value_ptr_;
    dest = mutable_value(this->entry_);
    MoveHelper<false,_true,_true,_CoreML::Specification::MILSpec::Value>::Move(pVVar3,dest);
    Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>::erase<std::__cxx11::string>
              ((Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value> *)this->map_,
               &this->key_);
  }
  else {
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
LAB_002987dd:
    NewEntry(this);
  }
  dest_00 = mutable_key(this->entry_);
  MoveHelper<false,_false,_true,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Move(&this->key_,dest_00);
LAB_00298826:
  ctx_local = (ParseContext *)
              MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
              ::_InternalParse(this->entry_,(char *)ctx_local,ctx);
  if (ctx_local != (ParseContext *)0x0) {
    UseKeyAndValueFromEntry(this);
  }
  return (char *)ctx_local;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }